

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::PoissonRegressionLoss::forward_impl
          (PoissonRegressionLoss *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  float __x;
  uint uVar1;
  float fVar2;
  __type_conflict1 _Var3;
  undefined1 auVar4 [16];
  undefined1 in_ZMM1 [64];
  
  auVar4 = in_ZMM1._0_16_;
  uVar1 = *this->pty;
  _Var3 = std::lgamma<unsigned_int>(uVar1 + 1);
  __x = *(*(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
           _M_impl.super__Vector_impl_data._M_start)->v;
  fVar2 = expf(__x);
  auVar4 = vcvtusi2ss_avx512f(auVar4,uVar1);
  *fx->v = (float)(((double)fVar2 + _Var3) - (double)(auVar4._0_4_ * __x));
  return;
}

Assistant:

void PoissonRegressionLoss::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("PoissonRegressionLoss not yet implemented for CUDA");
#else
  const auto y = *pty;
  const auto z = lgamma(y + 1);
  const auto x = xs[0]->v[0];
  fx.v[0] = expf(x) + z - y * x;
#endif
}